

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O1

bool Qentem::Digit::parseExponent<char16_t>
               (char16_t *content,SizeT32 *exponent,bool *is_negative_exp,SizeT *offset,
               SizeT end_offset)

{
  bool bVar1;
  uint uVar2;
  SizeT SVar3;
  
  uVar2 = *offset;
  if (uVar2 < end_offset) {
    bVar1 = false;
    do {
      if (content[uVar2] == L'+') {
        if (bVar1) {
          return false;
        }
        *offset = uVar2 + 1;
      }
      else {
        if (content[uVar2] != L'-') {
          SVar3 = *offset;
          while ((SVar3 < end_offset && ((ushort)(content[SVar3] + L'￐') < 10))) {
            *exponent = ((ushort)content[SVar3] - 0x30) + *exponent * 10;
            SVar3 = *offset + 1;
            *offset = SVar3;
          }
          return uVar2 != *offset;
        }
        if (bVar1) {
          return false;
        }
        *offset = uVar2 + 1;
        *is_negative_exp = true;
      }
      uVar2 = uVar2 + 1;
      bVar1 = true;
    } while (uVar2 < end_offset);
  }
  return false;
}

Assistant:

static bool parseExponent(const Char_T *content, SizeT32 &exponent, bool &is_negative_exp, SizeT &offset,
                              const SizeT end_offset) noexcept {
        bool sign_set{false};

        while (offset < end_offset) {
            switch (content[offset]) {
                case DigitUtils::DigitChar::Positive: {
                    if (!sign_set) {
                        ++offset;
                        sign_set = true;
                        break;
                    }

                    return false;
                }
                case DigitUtils::DigitChar::Negative: {
                    if (!sign_set) {
                        ++offset;
                        is_negative_exp = true;
                        sign_set        = true;
                        break;
                    }

                    return false;
                }

                default: {
                    const SizeT o_offset = offset;

                    while (offset < end_offset) {
                        const Char_T digit = content[offset];

                        if ((digit >= DigitUtils::DigitChar::Zero) && (digit <= DigitUtils::DigitChar::Nine)) {
                            exponent *= SizeT32{10};
                            exponent += SizeT32(digit - DigitUtils::DigitChar::Zero);
                            ++offset;
                            continue;
                        }

                        break;
                    }

                    return (o_offset != offset);
                }
            }
        }

        return false;
    }